

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmss.cpp
# Opt level: O0

void __thiscall lmss::heartbeat(lmss *this,int param_1)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  system_error *this_00;
  error_category *__ecat;
  undefined1 local_20 [8];
  uint64_t count;
  lmss *plStack_10;
  int param_1_local;
  lmss *this_local;
  
  count._4_4_ = param_1;
  plStack_10 = this;
  iVar1 = file_descriptor::operator*(&this->tfd);
  sVar2 = read(iVar1,local_20,8);
  if ((sVar2 < 0) && (piVar3 = __errno_location(), *piVar3 != 0xb)) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_00,iVar1,__ecat,"failed to read timer");
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  usb_dev::heartbeat(&this->usb);
  return;
}

Assistant:

void lmss::heartbeat(int) {
    uint64_t count;
    if (__builtin_expect(::read(*tfd, &count, sizeof(count)), sizeof(count)) < 0) {
        if (errno != EAGAIN) {
            throw std::system_error(errno, std::system_category(), "failed to read timer");
        }
    }
    usb.heartbeat();
}